

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2UTF8(void)

{
  bool bVar1;
  __type _Var2;
  ostream *poVar3;
  LogMessage local_17d0;
  StringPiece local_1650;
  undefined1 local_1640 [8];
  RE2 re_test8;
  StringPiece local_13e0;
  Options local_13d0;
  StringPiece local_13b8;
  undefined1 local_13a8 [8];
  RE2 re_test7;
  StringPiece local_1148;
  undefined1 local_1138 [8];
  RE2 re_test6;
  StringPiece local_ed8;
  Options local_ec8;
  StringPiece local_eb0;
  undefined1 local_ea0 [8];
  RE2 re_test5;
  allocator local_c39;
  string local_c38 [32];
  LogMessage local_c18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a98;
  StringPiece local_a90;
  undefined1 local_a80 [8];
  RE2 re_test4;
  allocator local_819;
  string local_818 [32];
  LogMessage local_7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_678;
  StringPiece local_670;
  Options local_660;
  StringPiece local_648;
  undefined1 local_638 [8];
  RE2 re_test3;
  string s;
  LogMessage local_538;
  StringPiece local_3b8;
  undefined1 local_3a8 [8];
  RE2 re_test2;
  StringPiece local_138;
  Options local_128;
  StringPiece local_110;
  undefined1 local_100 [8];
  RE2 re_test1;
  char utf8_pattern [6];
  char utf8_string [10];
  
  _utf8_pattern = 0xaae8ac9ce6a597e6;
  re_test1.group_names_once_._M_once._0_2_ = 0x2e;
  re_test1.named_groups_once_._M_once = -0x536319d2;
  StringPiece::StringPiece(&local_110,".........");
  RE2::Options::Options(&local_128,Latin1);
  RE2::RE2((RE2 *)local_100,&local_110,&local_128);
  StringPiece::StringPiece(&local_138,utf8_pattern);
  bVar1 = RE2::FullMatch<>(&local_138,(RE2 *)local_100);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&re_test2.named_groups_once_,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x43c);
    poVar3 = LogMessage::stream((LogMessage *)&re_test2.named_groups_once_);
    std::operator<<(poVar3,"Check failed: RE2::FullMatch(utf8_string, re_test1)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&re_test2.named_groups_once_);
  }
  RE2::RE2((RE2 *)local_3a8,"...");
  StringPiece::StringPiece(&local_3b8,utf8_pattern);
  bVar1 = RE2::FullMatch<>(&local_3b8,(RE2 *)local_3a8);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_538,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x43e);
    poVar3 = LogMessage::stream(&local_538);
    std::operator<<(poVar3,"Check failed: RE2::FullMatch(utf8_string, re_test2)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_538);
  }
  std::__cxx11::string::string((string *)&re_test3.named_groups_once_);
  StringPiece::StringPiece(&local_648,"(.)");
  RE2::Options::Options(&local_660,Latin1);
  RE2::RE2((RE2 *)local_638,&local_648,&local_660);
  StringPiece::StringPiece(&local_670,utf8_pattern);
  local_678 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &re_test3.named_groups_once_;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*>(&local_670,(RE2 *)local_638,&local_678);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_7f8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x444);
    poVar3 = LogMessage::stream(&local_7f8);
    std::operator<<(poVar3,"Check failed: RE2::PartialMatch(utf8_string, re_test3, &s)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_7f8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_818,anon_var_dwarf_57f6,&local_819);
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &re_test3.named_groups_once_,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_818);
  std::__cxx11::string::~string(local_818);
  std::allocator<char>::~allocator((allocator<char> *)&local_819);
  if (!_Var2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&re_test4.named_groups_once_,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x445);
    poVar3 = LogMessage::stream((LogMessage *)&re_test4.named_groups_once_);
    std::operator<<(poVar3,"Check failed: (s) == (string(\"\\xe6\"))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&re_test4.named_groups_once_);
  }
  RE2::RE2((RE2 *)local_a80,"(.)");
  StringPiece::StringPiece(&local_a90,utf8_pattern);
  local_a98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &re_test3.named_groups_once_;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*>(&local_a90,(RE2 *)local_a80,&local_a98);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_c18,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x447);
    poVar3 = LogMessage::stream(&local_c18);
    std::operator<<(poVar3,"Check failed: RE2::PartialMatch(utf8_string, re_test4, &s)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_c18);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c38,anon_var_dwarf_581a,&local_c39);
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &re_test3.named_groups_once_,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_c38);
  std::__cxx11::string::~string(local_c38);
  std::allocator<char>::~allocator((allocator<char> *)&local_c39);
  if (!_Var2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&re_test5.named_groups_once_,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x448);
    poVar3 = LogMessage::stream((LogMessage *)&re_test5.named_groups_once_);
    std::operator<<(poVar3,"Check failed: (s) == (string(\"\\xe6\\x97\\xa5\"))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&re_test5.named_groups_once_);
  }
  StringPiece::StringPiece(&local_eb0,utf8_pattern);
  RE2::Options::Options(&local_ec8,Latin1);
  RE2::RE2((RE2 *)local_ea0,&local_eb0,&local_ec8);
  StringPiece::StringPiece(&local_ed8,utf8_pattern);
  bVar1 = RE2::FullMatch<>(&local_ed8,(RE2 *)local_ea0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&re_test6.named_groups_once_,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x44c);
    poVar3 = LogMessage::stream((LogMessage *)&re_test6.named_groups_once_);
    std::operator<<(poVar3,"Check failed: RE2::FullMatch(utf8_string, re_test5)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&re_test6.named_groups_once_);
  }
  RE2::RE2((RE2 *)local_1138,utf8_pattern);
  StringPiece::StringPiece(&local_1148,utf8_pattern);
  bVar1 = RE2::FullMatch<>(&local_1148,(RE2 *)local_1138);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&re_test7.named_groups_once_,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x44e);
    poVar3 = LogMessage::stream((LogMessage *)&re_test7.named_groups_once_);
    std::operator<<(poVar3,"Check failed: RE2::FullMatch(utf8_string, re_test6)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&re_test7.named_groups_once_);
  }
  StringPiece::StringPiece(&local_13b8,(char *)&re_test1.named_groups_once_);
  RE2::Options::Options(&local_13d0,Latin1);
  RE2::RE2((RE2 *)local_13a8,&local_13b8,&local_13d0);
  StringPiece::StringPiece(&local_13e0,utf8_pattern);
  bVar1 = RE2::FullMatch<>(&local_13e0,(RE2 *)local_13a8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&re_test8.named_groups_once_,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x452);
    poVar3 = LogMessage::stream((LogMessage *)&re_test8.named_groups_once_);
    std::operator<<(poVar3,"Check failed: !RE2::FullMatch(utf8_string, re_test7)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&re_test8.named_groups_once_);
  }
  RE2::RE2((RE2 *)local_1640,(char *)&re_test1.named_groups_once_);
  StringPiece::StringPiece(&local_1650,utf8_pattern);
  bVar1 = RE2::FullMatch<>(&local_1650,(RE2 *)local_1640);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_17d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x454);
    poVar3 = LogMessage::stream(&local_17d0);
    std::operator<<(poVar3,"Check failed: RE2::FullMatch(utf8_string, re_test8)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_17d0);
  }
  RE2::~RE2((RE2 *)local_1640);
  RE2::~RE2((RE2 *)local_13a8);
  RE2::~RE2((RE2 *)local_1138);
  RE2::~RE2((RE2 *)local_ea0);
  RE2::~RE2((RE2 *)local_a80);
  RE2::~RE2((RE2 *)local_638);
  std::__cxx11::string::~string((string *)&re_test3.named_groups_once_);
  RE2::~RE2((RE2 *)local_3a8);
  RE2::~RE2((RE2 *)local_100);
  return;
}

Assistant:

TEST(RE2, UTF8) {
  // Check UTF-8 handling
  // Three Japanese characters (nihongo)
  const char utf8_string[] = {
       (char)0xe6, (char)0x97, (char)0xa5, // 65e5
       (char)0xe6, (char)0x9c, (char)0xac, // 627c
       (char)0xe8, (char)0xaa, (char)0x9e, // 8a9e
       0
  };
  const char utf8_pattern[] = {
       '.',
       (char)0xe6, (char)0x9c, (char)0xac, // 627c
       '.',
       0
  };

  // Both should match in either mode, bytes or UTF-8
  RE2 re_test1(".........", RE2::Latin1);
  CHECK(RE2::FullMatch(utf8_string, re_test1));
  RE2 re_test2("...");
  CHECK(RE2::FullMatch(utf8_string, re_test2));

  // Check that '.' matches one byte or UTF-8 character
  // according to the mode.
  string s;
  RE2 re_test3("(.)", RE2::Latin1);
  CHECK(RE2::PartialMatch(utf8_string, re_test3, &s));
  CHECK_EQ(s, string("\xe6"));
  RE2 re_test4("(.)");
  CHECK(RE2::PartialMatch(utf8_string, re_test4, &s));
  CHECK_EQ(s, string("\xe6\x97\xa5"));

  // Check that string matches itself in either mode
  RE2 re_test5(utf8_string, RE2::Latin1);
  CHECK(RE2::FullMatch(utf8_string, re_test5));
  RE2 re_test6(utf8_string);
  CHECK(RE2::FullMatch(utf8_string, re_test6));

  // Check that pattern matches string only in UTF8 mode
  RE2 re_test7(utf8_pattern, RE2::Latin1);
  CHECK(!RE2::FullMatch(utf8_string, re_test7));
  RE2 re_test8(utf8_pattern);
  CHECK(RE2::FullMatch(utf8_string, re_test8));
}